

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall
DMessageBoxMenu::Init
          (DMessageBoxMenu *this,DMenu *parent,char *message,int messagemode,bool playsound)

{
  FBrokenLines *pFVar1;
  FSoundID local_1c;
  
  (this->super_DMenu).mParentMenu.field_0.p = parent;
  if (message == (char *)0x0) {
    pFVar1 = (FBrokenLines *)0x0;
  }
  else {
    if (*message == '$') {
      message = FStringTable::operator()(&GStrings,message + 1);
    }
    pFVar1 = V_BreakLines(SmallFont,300,(BYTE *)message,false);
  }
  this->mMessage = pFVar1;
  this->mMessageMode = messagemode;
  if (playsound) {
    S_StopSound(2);
    local_1c.ID = S_FindSound("menu/prompt");
    S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
  }
  return;
}

Assistant:

void DMessageBoxMenu::Init(DMenu *parent, const char *message, int messagemode, bool playsound)
{
	mParentMenu = parent;
	if (message != NULL) 
	{
		if (*message == '$') message = GStrings(message+1);
		mMessage = V_BreakLines(SmallFont, 300, message);
	}
	else mMessage = NULL;
	mMessageMode = messagemode;
	if (playsound)
	{
		S_StopSound (CHAN_VOICE);
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/prompt", snd_menuvolume, ATTN_NONE);
	}
}